

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O3

void masc::polygon::box2ply(obb *box,Polygon *poly)

{
  pointer *ppPVar1;
  iterator iVar2;
  Point local_28;
  
  local_28.x = box->corners[0].v[0];
  local_28.y = box->corners[0].v[1];
  iVar2._M_current =
       (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<svg::Point,std::allocator<svg::Point>>::_M_realloc_insert<svg::Point_const&>
              ((vector<svg::Point,std::allocator<svg::Point>> *)&poly->points,iVar2,&local_28);
    iVar2._M_current =
         (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar2._M_current)->x = local_28.x;
    (iVar2._M_current)->y = local_28.y;
    iVar2._M_current =
         (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_28.x = box->corners[1].v[0];
  local_28.y = box->corners[1].v[1];
  if (iVar2._M_current ==
      (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<svg::Point,std::allocator<svg::Point>>::_M_realloc_insert<svg::Point_const&>
              ((vector<svg::Point,std::allocator<svg::Point>> *)&poly->points,iVar2,&local_28);
    iVar2._M_current =
         (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar2._M_current)->x = local_28.x;
    (iVar2._M_current)->y = local_28.y;
    iVar2._M_current =
         (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_28.x = box->corners[2].v[0];
  local_28.y = box->corners[2].v[1];
  if (iVar2._M_current ==
      (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<svg::Point,std::allocator<svg::Point>>::_M_realloc_insert<svg::Point_const&>
              ((vector<svg::Point,std::allocator<svg::Point>> *)&poly->points,iVar2,&local_28);
    iVar2._M_current =
         (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar2._M_current)->x = local_28.x;
    (iVar2._M_current)->y = local_28.y;
    iVar2._M_current =
         (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_28.x = box->corners[3].v[0];
  local_28.y = box->corners[3].v[1];
  if (iVar2._M_current ==
      (poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<svg::Point,std::allocator<svg::Point>>::_M_realloc_insert<svg::Point_const&>
              ((vector<svg::Point,std::allocator<svg::Point>> *)&poly->points,iVar2,&local_28);
  }
  else {
    (iVar2._M_current)->x = local_28.x;
    (iVar2._M_current)->y = local_28.y;
    ppPVar1 = &(poly->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  svg::Polygon::endBoundary(poly);
  return;
}

Assistant:

void box2ply(const masc::polygon::obb& box, svg::Polygon& poly)
{
    poly << svg::Point(box.corners[0][0], box.corners[0][1]);
    poly << svg::Point(box.corners[1][0], box.corners[1][1]);
    poly << svg::Point(box.corners[2][0], box.corners[2][1]);
    poly << svg::Point(box.corners[3][0], box.corners[3][1]);
    poly.endBoundary();
}